

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

float Abc_SclCountNonBufferLoadInt(SC_Man *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  fVar8 = 0.0;
  if (((*(uint *)&pObj->field_0x14 & 0xf) != 7) || ((pObj->vFanins).nSize != 1)) {
    return 0.0;
  }
  if ((pObj->vFanouts).nSize < 1) {
    fVar8 = 0.0;
  }
  else {
    lVar6 = 0;
    do {
      fVar7 = Abc_SclCountNonBufferLoadInt
                        (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]]);
      fVar8 = fVar8 + fVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pObj->vFanouts).nSize);
  }
  uVar1 = pObj->Id;
  if ((int)uVar1 < 0) {
LAB_003f8975:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pObj->pNtk;
  if (pAVar3->vGates->nSize <= (int)uVar1) goto LAB_003f8975;
  uVar2 = pAVar3->vGates->pArray[uVar1];
  uVar5 = (ulong)uVar2;
  if (uVar5 == 0xffffffff) {
    lVar6 = 0;
  }
  else {
    if (((int)uVar2 < 0) || (*(int *)((long)pAVar3->pSCLib + 100) <= (int)uVar2)) goto LAB_003f8956;
    lVar6 = *(long *)(*(long *)((long)pAVar3->pSCLib + 0x68) + uVar5 * 8);
  }
  if (0 < *(int *)(lVar6 + 0x34)) {
    if (uVar2 == 0xffffffff) {
      lVar4 = 0;
    }
    else {
      if (((int)uVar2 < 0) || (*(int *)((long)pAVar3->pSCLib + 100) <= (int)uVar2))
      goto LAB_003f8956;
      lVar4 = *(long *)(*(long *)((long)pAVar3->pSCLib + 0x68) + uVar5 * 8);
    }
    if (0 < *(int *)(lVar4 + 0x34)) {
      return (p->pLoads[uVar1].rise * 0.5 + p->pLoads[uVar1].fall * 0.5 + fVar8) -
             (*(float *)(**(long **)(lVar6 + 0x38) + 0x10) * 0.5 +
             *(float *)(**(long **)(lVar4 + 0x38) + 0x14) * 0.5);
    }
  }
LAB_003f8956:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

float Abc_SclCountNonBufferLoadInt( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load = 0;
    int i; 
    if ( !Abc_ObjIsBuffer(pObj) )
        return 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Abc_SclCountNonBufferLoadInt( p, pFanout );
    Load += 0.5 * Abc_SclObjLoad(p, pObj)->rise + 0.5 * Abc_SclObjLoad(p, pObj)->fall;
    Load -= 0.5 * SC_CellPin(Abc_SclObjCell(pObj), 0)->rise_cap + 0.5 * SC_CellPin(Abc_SclObjCell(pObj), 0)->fall_cap;
    return Load;
}